

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game.cpp
# Opt level: O1

void __thiscall game::undoMove(game *this)

{
  long lVar1;
  _Elt_pointer pbVar2;
  _Elt_pointer pbVar3;
  game *pgVar4;
  
  pbVar2 = (this->boardHistory).c.super__Deque_base<bitboards,_std::allocator<bitboards>_>._M_impl.
           super__Deque_impl_data._M_finish._M_cur;
  if (pbVar2 == (this->boardHistory).c.super__Deque_base<bitboards,_std::allocator<bitboards>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_first) {
    pbVar2 = (this->boardHistory).c.super__Deque_base<bitboards,_std::allocator<bitboards>_>._M_impl
             .super__Deque_impl_data._M_finish._M_node[-1] + 4;
  }
  pbVar3 = pbVar2 + -1;
  pgVar4 = this;
  for (lVar1 = 0xc; lVar1 != 0; lVar1 = lVar1 + -1) {
    (pgVar4->boards).WP = pbVar3->WP;
    pbVar3 = (_Elt_pointer)&pbVar3->WN;
    pgVar4 = (game *)&(pgVar4->boards).WN;
  }
  (this->boards).castleInfo = pbVar2[-1].castleInfo;
  std::deque<bitboards,_std::allocator<bitboards>_>::pop_back(&(this->boardHistory).c);
  std::deque<move,_std::allocator<move>_>::pop_back(&(this->history).c);
  this->blacksTurn = (bool)(this->blacksTurn ^ 1);
  return;
}

Assistant:

void game::undoMove() {
    boards = boardHistory.top();
    boardHistory.pop();
    history.pop();
    blacksTurn = !blacksTurn;
}